

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

void __thiscall spvtools::opt::SSAPropagator::Initialize(SSAPropagator *this,Function *fn)

{
  value_type *b1;
  Function *this_00;
  bool bVar1;
  CFG *pCVar2;
  mapped_type *pmVar3;
  BasicBlock *pBVar4;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_01;
  pointer b2;
  reference this_02;
  reference edge;
  Edge *e;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  mapped_type *__range2_1;
  mapped_type *local_d0;
  mapped_type *entry_succs;
  BasicBlock *local_b8;
  Edge local_b0;
  value_type *local_a0;
  anon_class_16_2_f791057a local_98;
  function<void_(unsigned_int)> local_88;
  reference local_68;
  value_type *const_block;
  value_type *block;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  BasicBlock *local_20;
  Function *local_18;
  Function *fn_local;
  SSAPropagator *this_local;
  
  local_18 = fn;
  fn_local = (Function *)this;
  pCVar2 = IRContext::cfg(this->ctx_);
  local_20 = CFG::pseudo_entry_block(pCVar2);
  pmVar3 = std::
           unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
           ::operator[](&this->bb_succs_,&local_20);
  pCVar2 = IRContext::cfg(this->ctx_);
  pBVar4 = CFG::pseudo_entry_block(pCVar2);
  this_01 = opt::Function::entry(local_18);
  b2 = std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
       get(this_01);
  Edge::Edge((Edge *)&__range2,pBVar4,b2);
  std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::push_back
            (pmVar3,(value_type *)&__range2);
  this_00 = local_18;
  join_0x00000010_0x00000000_ = opt::Function::begin(local_18);
  _block = opt::Function::end(this_00);
  while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                            &__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block), bVar1)
  {
    this_02 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    local_98.this = this;
    local_98.block = this_02;
    local_68 = this_02;
    const_block = this_02;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::SSAPropagator::Initialize(spvtools::opt::Function*)::__0,void>
              ((function<void(unsigned_int)> *)&local_88,&local_98);
    BasicBlock::ForEachSuccessorLabel(this_02,&local_88);
    std::function<void_(unsigned_int)>::~function(&local_88);
    bVar1 = BasicBlock::IsReturnOrAbort(const_block);
    if (bVar1) {
      local_a0 = const_block;
      pmVar3 = std::
               unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
               ::operator[](&this->bb_succs_,&local_a0);
      b1 = const_block;
      pCVar2 = IRContext::cfg(this->ctx_);
      pBVar4 = CFG::pseudo_exit_block(pCVar2);
      Edge::Edge(&local_b0,b1,pBVar4);
      std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::push_back
                (pmVar3,&local_b0);
      pCVar2 = IRContext::cfg(this->ctx_);
      local_b8 = CFG::pseudo_exit_block(pCVar2);
      pmVar3 = std::
               unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
               ::operator[](&this->bb_preds_,&local_b8);
      pCVar2 = IRContext::cfg(this->ctx_);
      pBVar4 = CFG::pseudo_exit_block(pCVar2);
      Edge::Edge((Edge *)&entry_succs,pBVar4,const_block);
      std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::push_back
                (pmVar3,(value_type *)&entry_succs);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  pCVar2 = IRContext::cfg(this->ctx_);
  __range2_1 = (mapped_type *)CFG::pseudo_entry_block(pCVar2);
  pmVar3 = std::
           unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
           ::operator[](&this->bb_succs_,(key_type *)&__range2_1);
  local_d0 = pmVar3;
  __end2_1 = std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::begin(pmVar3);
  e = (Edge *)std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::end(pmVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
                             *)&e), bVar1) {
    edge = __gnu_cxx::
           __normal_iterator<const_spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
           ::operator*(&__end2_1);
    AddControlEdge(this,edge);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void SSAPropagator::Initialize(Function* fn) {
  // Compute predecessor and successor blocks for every block in |fn|'s CFG.
  // TODO(dnovillo): Move this to CFG and always build them. Alternately,
  // move it to IRContext and build CFG preds/succs on-demand.
  bb_succs_[ctx_->cfg()->pseudo_entry_block()].push_back(
      Edge(ctx_->cfg()->pseudo_entry_block(), fn->entry().get()));

  for (auto& block : *fn) {
    const auto& const_block = block;
    const_block.ForEachSuccessorLabel([this, &block](const uint32_t label_id) {
      BasicBlock* succ_bb =
          ctx_->get_instr_block(get_def_use_mgr()->GetDef(label_id));
      bb_succs_[&block].push_back(Edge(&block, succ_bb));
      bb_preds_[succ_bb].push_back(Edge(succ_bb, &block));
    });
    if (block.IsReturnOrAbort()) {
      bb_succs_[&block].push_back(
          Edge(&block, ctx_->cfg()->pseudo_exit_block()));
      bb_preds_[ctx_->cfg()->pseudo_exit_block()].push_back(
          Edge(ctx_->cfg()->pseudo_exit_block(), &block));
    }
  }

  // Add the edges out of the entry block to seed the propagator.
  const auto& entry_succs = bb_succs_[ctx_->cfg()->pseudo_entry_block()];
  for (const auto& e : entry_succs) {
    AddControlEdge(e);
  }
}